

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LinearSpace3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,size_t primID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vfloat4 a0_1;
  vfloat4 a0;
  undefined1 auVar14 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->
                                      super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                      super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar9 = sVar4 * uVar1;
  lVar8 = sVar4 * (uVar1 + 1);
  pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar6 = uVar1 * sVar4;
  lVar7 = sVar4 * (uVar1 + 1);
  fVar17 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar9),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar9 + 0xc))),0x30);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar8),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar8 + 0xc))),0x30);
  auVar18 = ZEXT816(0) << 0x20;
  auVar13 = vsubps_avx(auVar12,auVar14);
  auVar11 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar30 = auVar11._0_4_;
  auVar29._4_12_ = SUB1612(ZEXT816(0),0);
  auVar29._0_4_ = fVar30;
  auVar11 = vrsqrt14ss_avx512f(auVar18,auVar29);
  fVar26 = auVar11._0_4_;
  fVar26 = fVar26 * 1.5 + fVar30 * -0.5 * fVar26 * fVar26 * fVar26;
  auVar11._0_4_ = auVar13._0_4_ * fVar26;
  auVar11._4_4_ = auVar13._4_4_ * fVar26;
  auVar11._8_4_ = auVar13._8_4_ * fVar26;
  auVar11._12_4_ = auVar13._12_4_ * fVar26;
  if (1e-18 < fVar30) {
    pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar6),
                            ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar6 + 0xc))),0x30);
    auVar29 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar7),
                            ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar7 + 0xc))),0x30);
    auVar31._8_4_ = 0xbeaaaaab;
    auVar31._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar31._12_4_ = 0xbeaaaaab;
    auVar16 = vfnmadd213ps_fma(auVar13,auVar31,auVar14);
    auVar13 = vfmadd213ps_fma(auVar29,auVar31,auVar12);
    auVar21._0_4_ = auVar12._0_4_ * 0.0;
    auVar21._4_4_ = auVar12._4_4_ * 0.0;
    auVar21._8_4_ = auVar12._8_4_ * 0.0;
    auVar21._12_4_ = auVar12._12_4_ * 0.0;
    auVar12 = vfmadd231ps_fma(auVar21,auVar18,auVar13);
    auVar13._8_4_ = 0xc0400000;
    auVar13._0_8_ = 0xc0400000c0400000;
    auVar13._12_4_ = 0xc0400000;
    auVar12 = vfnmadd231ps_fma(auVar12,auVar13,auVar16);
    auVar13 = vfmadd231ps_fma(auVar12,auVar14,auVar13);
    auVar14 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar12 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar18._0_4_ = auVar13._0_4_ * auVar12._0_4_;
    auVar18._4_4_ = auVar13._4_4_ * auVar12._4_4_;
    auVar18._8_4_ = auVar13._8_4_ * auVar12._8_4_;
    auVar18._12_4_ = auVar13._12_4_ * auVar12._12_4_;
    auVar14 = vfmsub231ps_fma(auVar18,auVar11,auVar14);
    auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  }
  else {
    auVar14 = ZEXT816(0x3f80000000000000);
    auVar11 = _DAT_01f46750;
  }
  auVar12 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar17 = auVar12._0_4_;
  if (fVar17 <= 1e-18) {
    auVar12 = vshufpd_avx(auVar11,auVar11,1);
    auVar14 = vmovshdup_avx(auVar11);
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar20._0_4_ = auVar14._0_4_ ^ 0x80000000;
    auVar25 = ZEXT812(0) << 0x20;
    auVar29 = ZEXT816(0) << 0x40;
    auVar14 = vunpckhps_avx(auVar11,auVar29);
    auVar20._4_12_ = auVar25;
    auVar18 = vshufps_avx(auVar14,auVar20,0x41);
    auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
    auVar16._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
    auVar16._8_8_ = auVar12._8_8_ ^ auVar22._8_8_;
    auVar13 = vinsertps_avx(auVar16,auVar11,0x2a);
    auVar12 = vdpps_avx(auVar13,auVar13,0x7f);
    uVar5 = vcmpps_avx512vl(auVar12,auVar14,1);
    auVar14 = vpmovm2d_avx512vl(uVar5);
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    uVar10 = vpmovd2m_avx512vl(auVar14);
    auVar14 = vpcmpeqd_avx(auVar14,auVar14);
    auVar12._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar14._4_4_;
    auVar12._0_4_ = (uint)((byte)uVar10 & 1) * auVar14._0_4_;
    auVar12._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar14._8_4_;
    auVar12._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar14._12_4_;
    auVar14 = vblendvps_avx(auVar13,auVar18,auVar12);
    auVar12 = vdpps_avx(auVar14,auVar14,0x7f);
    auVar23._4_12_ = auVar25;
    auVar23._0_4_ = auVar12._0_4_;
    auVar13 = vrsqrt14ss_avx512f(auVar29,auVar23);
    fVar17 = auVar13._0_4_;
    fVar17 = fVar17 * 1.5 - auVar12._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar19._0_4_ = auVar14._0_4_ * fVar17;
    aVar19._4_4_ = auVar14._4_4_ * fVar17;
    aVar19._8_4_ = auVar14._8_4_ * fVar17;
    aVar19._12_4_ = auVar14._12_4_ * fVar17;
    auVar14 = vshufps_avx((undefined1  [16])aVar19,(undefined1  [16])aVar19,0xc9);
    auVar12 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar24._0_4_ = aVar19._0_4_ * auVar12._0_4_;
    auVar24._4_4_ = aVar19._4_4_ * auVar12._4_4_;
    auVar24._8_4_ = aVar19._8_4_ * auVar12._8_4_;
    auVar24._12_4_ = aVar19._12_4_ * auVar12._12_4_;
    auVar14 = vfmsub231ps_fma(auVar24,auVar11,auVar14);
    auVar12 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vdpps_avx(auVar12,auVar12,0x7f);
    auVar33._4_12_ = auVar25;
    auVar33._0_4_ = auVar14._0_4_;
    auVar13 = vrsqrt14ss_avx512f(auVar29,auVar33);
    fVar17 = auVar13._0_4_;
    fVar17 = fVar17 * 1.5 - auVar14._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar15._0_4_ = fVar17 * auVar12._0_4_;
    aVar15._4_4_ = fVar17 * auVar12._4_4_;
    aVar15._8_4_ = fVar17 * auVar12._8_4_;
    aVar15._12_4_ = fVar17 * auVar12._12_4_;
  }
  else {
    auVar25 = SUB1612(ZEXT416(0),0) << 0x20;
    auVar13 = ZEXT416(0) << 0x40;
    auVar27._4_12_ = auVar25;
    auVar27._0_4_ = fVar17;
    auVar12 = vrsqrt14ss_avx512f(auVar13,auVar27);
    fVar26 = auVar12._0_4_;
    fVar17 = fVar26 * 1.5 - fVar17 * 0.5 * fVar26 * fVar26 * fVar26;
    aVar15._0_4_ = auVar14._0_4_ * fVar17;
    aVar15._4_4_ = auVar14._4_4_ * fVar17;
    aVar15._8_4_ = auVar14._8_4_ * fVar17;
    aVar15._12_4_ = auVar14._12_4_ * fVar17;
    auVar14 = vshufps_avx(auVar11,auVar11,0xc9);
    auVar12 = vshufps_avx((undefined1  [16])aVar15,(undefined1  [16])aVar15,0xc9);
    auVar28._0_4_ = auVar11._0_4_ * auVar12._0_4_;
    auVar28._4_4_ = auVar11._4_4_ * auVar12._4_4_;
    auVar28._8_4_ = auVar11._8_4_ * auVar12._8_4_;
    auVar28._12_4_ = auVar11._12_4_ * auVar12._12_4_;
    auVar14 = vfmsub231ps_fma(auVar28,(undefined1  [16])aVar15,auVar14);
    auVar12 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vdpps_avx(auVar12,auVar12,0x7f);
    auVar32._4_12_ = auVar25;
    auVar32._0_4_ = auVar14._0_4_;
    auVar13 = vrsqrt14ss_avx512f(auVar13,auVar32);
    fVar17 = auVar13._0_4_;
    fVar17 = fVar17 * 1.5 - auVar14._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar19._0_4_ = fVar17 * auVar12._0_4_;
    aVar19._4_4_ = fVar17 * auVar12._4_4_;
    aVar19._8_4_ = fVar17 * auVar12._8_4_;
    aVar19._12_4_ = fVar17 * auVar12._12_4_;
  }
  (__return_storage_ptr__->vx).field_0 = aVar19;
  (__return_storage_ptr__->vy).field_0 = aVar15;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar11;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);
        
        const Curve3ff curve = getCurveScaledRadius(primID);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }